

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DenseMap.h
# Opt level: O2

bool * __thiscall
SmallDenseMap<unsigned_long,_bool,_PointerHasher,_1024U>::find
          (SmallDenseMap<unsigned_long,_bool,_PointerHasher,_1024U> *this,unsigned_long *key)

{
  uint uVar1;
  unsigned_long uVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  bool bVar6;
  PointerHasher local_19;
  
  uVar1 = this->bucketCount;
  uVar3 = PointerHasher::operator()(&local_19,*key);
  uVar4 = this->bucketCount;
  iVar5 = 0;
  while( true ) {
    bVar6 = uVar4 == 0;
    uVar4 = uVar4 - 1;
    if (bVar6) {
      return (bool *)0x0;
    }
    uVar3 = uVar3 & uVar1 - 1;
    uVar2 = this->data[uVar3].key;
    if (uVar2 == 0) break;
    if (uVar2 == *key) {
      return &this->data[uVar3].value;
    }
    uVar3 = uVar3 + iVar5 + 1;
    iVar5 = iVar5 + 1;
  }
  return (bool *)0x0;
}

Assistant:

Value* find(const Key& key) const
	{
		unsigned bucketMask = bucketCount - 1;
		unsigned bucket = Hasher()(key) & bucketMask;

		for(unsigned i = 0; i < bucketCount; i++)
		{
			Node &item = data[bucket];

			if(item.key == Key())
				return NULL;

			if(item.key == key)
				return &item.value;

			// Quadratic probing
			bucket = (bucket + i + 1) & bucketMask;
		}

		return NULL;
	}